

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O2

CMutableTransaction *
BuildSpendingTransaction
          (CMutableTransaction *__return_storage_ptr__,CScript *scriptSig,
          CScriptWitness *scriptWitness,CTransaction *txCredit)

{
  pointer pCVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long in_FS_OFFSET;
  undefined1 local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  CMutableTransaction::CMutableTransaction(__return_storage_ptr__);
  __return_storage_ptr__->version = 1;
  __return_storage_ptr__->nLockTime = 0;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize(&__return_storage_ptr__->vin,1);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&__return_storage_ptr__->vout,1);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&(((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                 _M_impl.super__Vector_impl_data._M_start)->scriptWitness).stack,
              &scriptWitness->stack);
  pCVar1 = (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = *(undefined8 *)(txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((long)&(pCVar1->prevout).hash + 0x10) =
       *(undefined8 *)((txCredit->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((long)&(pCVar1->prevout).hash + 0x18) = uVar4;
  *(undefined8 *)&(pCVar1->prevout).hash = uVar2;
  *(undefined8 *)((long)&(pCVar1->prevout).hash + 8) = uVar3;
  pCVar1 = (__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar1->prevout).n = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(pCVar1->scriptSig).super_CScriptBase,&scriptSig->super_CScriptBase);
  ((__return_storage_ptr__->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
   super__Vector_impl_data._M_start)->nSequence = 0xffffffff;
  local_48._16_8_ = 0;
  local_48._24_8_ = 0;
  local_48._0_8_ = (char *)0x0;
  local_48._8_8_ = 0;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&(((__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                _M_impl.super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase,
             (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_48);
  ((__return_storage_ptr__->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
   super__Vector_impl_data._M_start)->nValue =
       ((txCredit->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
        super__Vector_impl_data._M_start)->nValue;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CMutableTransaction BuildSpendingTransaction(const CScript& scriptSig, const CScriptWitness& scriptWitness, const CTransaction& txCredit)
{
    CMutableTransaction txSpend;
    txSpend.version = 1;
    txSpend.nLockTime = 0;
    txSpend.vin.resize(1);
    txSpend.vout.resize(1);
    txSpend.vin[0].scriptWitness = scriptWitness;
    txSpend.vin[0].prevout.hash = txCredit.GetHash();
    txSpend.vin[0].prevout.n = 0;
    txSpend.vin[0].scriptSig = scriptSig;
    txSpend.vin[0].nSequence = CTxIn::SEQUENCE_FINAL;
    txSpend.vout[0].scriptPubKey = CScript();
    txSpend.vout[0].nValue = txCredit.vout[0].nValue;

    return txSpend;
}